

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfd::core::ConfidentialTxOut::SetCommitment
          (ConfidentialTxOut *this,ConfidentialAssetId *asset,ConfidentialValue *confidential_value,
          ConfidentialNonce *nonce,ByteData *surjection_proof,ByteData *range_proof)

{
  if (&this->asset_ != asset) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->asset_).data_.data_,&(asset->data_).data_);
    (this->asset_).version_ = asset->version_;
  }
  if (&this->confidential_value_ != confidential_value) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->confidential_value_).data_.data_,&(confidential_value->data_).data_);
    (this->confidential_value_).version_ = confidential_value->version_;
  }
  if (&this->nonce_ != nonce) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->nonce_).data_.data_,&(nonce->data_).data_);
    (this->nonce_).version_ = nonce->version_;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&(this->surjection_proof_).data_,&surjection_proof->data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&(this->range_proof_).data_,&range_proof->data_);
  return;
}

Assistant:

void ConfidentialTxOut::SetCommitment(
    const ConfidentialAssetId &asset,
    const ConfidentialValue &confidential_value,
    const ConfidentialNonce &nonce, const ByteData &surjection_proof,
    const ByteData &range_proof) {
  asset_ = asset;
  confidential_value_ = confidential_value;
  SetNonce(nonce);
  surjection_proof_ = surjection_proof;
  range_proof_ = range_proof;
}